

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  int *piVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double local_60;
  vector<double,std::allocator<double>> *local_58;
  long local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  ulong local_38;
  
  local_50 = CONCAT44(local_50._4_4_,iRow);
  local_48 = (vector<int,std::allocator<int>> *)&this->PFindex;
  local_38 = (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (0 < aq->packCount) {
    local_58 = (vector<double,std::allocator<double>> *)&this->PFvalue;
    lVar6 = 0;
    lVar7 = 0;
    lVar9 = 0;
    do {
      piVar4 = (int *)((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
      iVar2._M_current =
           (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4);
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pdVar5 = (double *)
               ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6);
      iVar3._M_current =
           (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_58,iVar3,pdVar5);
      }
      else {
        *iVar3._M_current = *pdVar5;
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 4;
      lVar6 = lVar6 + 8;
    } while (lVar9 < aq->packCount);
  }
  local_50 = (long)(int)local_50;
  iVar8 = this->baseIndex[local_50];
  if (iVar8 < this->numCol) {
    iVar1 = this->Astart[iVar8];
    lVar6 = (long)iVar1;
    if (iVar1 < this->Astart[(long)iVar8 + 1]) {
      local_58 = (vector<double,std::allocator<double>> *)&this->PFvalue;
      lVar7 = lVar6 * 4;
      do {
        piVar4 = (int *)((long)this->Aindex + lVar7);
        iVar2._M_current =
             (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4)
          ;
        }
        else {
          *iVar2._M_current = *piVar4;
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_60 = -*(double *)((long)this->Avalue + lVar7 * 2);
        iVar3._M_current =
             (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_58,iVar3,&local_60);
        }
        else {
          *iVar3._M_current = local_60;
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 4;
      } while (lVar6 < this->Astart[(long)iVar8 + 1]);
    }
  }
  else {
    iVar8 = iVar8 - this->numCol;
    local_60 = (double)CONCAT44(local_60._4_4_,iVar8);
    iVar2._M_current =
         (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_48,iVar2,(int *)&local_60);
    }
    else {
      *iVar2._M_current = iVar8;
      (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar2._M_current + 1;
    }
    local_60 = -1.0;
    iVar3._M_current =
         (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->PFvalue,iVar3,&local_60);
    }
    else {
      *iVar3._M_current = -1.0;
      (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  local_40 = &this->PFstart;
  iVar8 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_60 = (double)CONCAT44(local_60._4_4_,iVar8);
  iVar2._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar2._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar2,(int *)&local_60);
  }
  else {
    *iVar2._M_current = iVar8;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  if (0 < ep->packCount) {
    local_58 = (vector<double,std::allocator<double>> *)&this->PFvalue;
    lVar9 = 0;
    lVar7 = 0;
    lVar6 = 0;
    do {
      piVar4 = (int *)((long)(ep->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
      iVar2._M_current =
           (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4);
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pdVar5 = (double *)
               ((long)(ep->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9);
      iVar3._M_current =
           (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_58,iVar3,pdVar5);
      }
      else {
        *iVar3._M_current = *pdVar5;
        (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 4;
      lVar9 = lVar9 + 8;
    } while (lVar6 < ep->packCount);
  }
  uVar10 = local_38 >> 2;
  iVar8 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_60 = (double)CONCAT44(local_60._4_4_,iVar8);
  iVar2._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar2._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar2,(int *)&local_60);
    iVar8 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 2);
  }
  else {
    *iVar2._M_current = iVar8;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  this->FtotalX = this->FtotalX + (iVar8 - (int)uVar10);
  pdVar5 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + local_50;
  iVar3._M_current =
       (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->PFpivotValue,iVar3,pdVar5);
  }
  else {
    *iVar3._M_current = *pdVar5;
    (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return;
}

Assistant:

void HFactor::updateAPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }

    int columnOut = baseIndex[iRow];
    if (columnOut >= numCol) {
        PFindex.push_back(columnOut - numCol);
        PFvalue.push_back(-1);
    } else {
        for (int k = Astart[columnOut]; k < Astart[columnOut + 1]; k++) {
            PFindex.push_back(Aindex[k]);
            PFvalue.push_back(-Avalue[k]);
        }
    }
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());
    FtotalX += PFindex.size() - PFcountX0;

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

}